

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O1

void __thiscall
cfd::api::json::DecodeRawTransactionTxIn::ConvertFromStruct
          (DecodeRawTransactionTxIn *this,DecodeRawTransactionTxInStruct *data)

{
  pointer pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *element;
  pointer __x;
  
  std::__cxx11::string::_M_assign((string *)&this->coinbase_);
  std::__cxx11::string::_M_assign((string *)&this->txid_);
  this->vout_ = data->vout;
  DecodeUnlockingScript::ConvertFromStruct(&this->script_sig_,&data->script_sig);
  __x = (data->txinwitness).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (data->txinwitness).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__x != pbVar1) {
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->txinwitness_).
                   super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ,__x);
      __x = __x + 1;
    } while (__x != pbVar1);
  }
  this->sequence_ = data->sequence;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void DecodeRawTransactionTxIn::ConvertFromStruct(
    const DecodeRawTransactionTxInStruct& data) {
  coinbase_ = data.coinbase;
  txid_ = data.txid;
  vout_ = data.vout;
  script_sig_.ConvertFromStruct(data.script_sig);
  txinwitness_.ConvertFromStruct(data.txinwitness);
  sequence_ = data.sequence;
  ignore_items = data.ignore_items;
}